

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<std::vector<int,std::allocator<int>>>
          (options_serializer_boost_po *this,base_option *base_option)

{
  type_info *ptVar1;
  typed_option<std::vector<int,_std::allocator<int>_>_> *this_00;
  long in_RSI;
  typed_option<std::vector<int,_std::allocator<int>_>_> typed;
  type_info *this_01;
  typed_option<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78;
  options_serializer_boost_po *in_stack_ffffffffffffff80;
  bool local_1;
  
  this_01 = *(type_info **)(in_RSI + 0x28);
  ptVar1 = (type_info *)std::type_info::hash_code(this_01);
  if (this_01 == ptVar1) {
    this_00 = (typed_option<std::vector<int,_std::allocator<int>_>_> *)
              __dynamic_cast(in_RSI,&config::base_option::typeinfo,
                             &typed_option<std::vector<int,std::allocator<int>>>::typeinfo,0);
    if (this_00 == (typed_option<std::vector<int,_std::allocator<int>_>_> *)0x0) {
      __cxa_bad_cast();
    }
    typed_option<std::vector<int,_std::allocator<int>_>_>::typed_option
              (this_00,(typed_option<std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffff48);
    serialize<int>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_1 = true;
    typed_option<std::vector<int,_std::allocator<int>_>_>::~typed_option(this_00);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }